

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool jsonip::parser::plus_<jsonip::parser::digit_>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  Reader *pRVar1;
  PositionType pcVar2;
  char *pcVar3;
  PositionType pcVar4;
  long lVar5;
  bool bVar6;
  PositionType pcVar7;
  
  pRVar1 = state->reader_;
  pcVar2 = pRVar1->buf_;
  pcVar3 = pRVar1->pos_;
  if (((long)pcVar3 - (long)pcVar2 == pRVar1->len_) || (9 < (byte)(*pcVar3 - 0x30U))) {
    bVar6 = false;
  }
  else {
    lVar5 = pRVar1->len_ - (long)pcVar3;
    pcVar7 = (PositionType)0x0;
    while( true ) {
      pRVar1->pos_ = pcVar3 + (long)(pcVar7 + 1);
      bVar6 = true;
      if ((pcVar2 + lVar5 + -1 == pcVar7) || (9 < (byte)(pcVar3[(long)(pcVar7 + 1)] - 0x30U)))
      break;
      pRVar1->pos_ = pcVar3 + (long)(pcVar7 + 2);
      if (pcVar2 + lVar5 + -2 == pcVar7) {
        return true;
      }
      if (9 < (byte)(pcVar3[(long)(pcVar7 + 2)] - 0x30U)) {
        return true;
      }
      pRVar1->pos_ = pcVar3 + (long)(pcVar7 + 3);
      if (pcVar2 + lVar5 + -3 == pcVar7) {
        return true;
      }
      if (9 < (byte)(pcVar3[(long)(pcVar7 + 3)] - 0x30U)) {
        return true;
      }
      pRVar1->pos_ = pcVar3 + (long)(pcVar7 + 4);
      if (pcVar2 + lVar5 + -4 == pcVar7) {
        return true;
      }
      if (9 < (byte)(pcVar3[(long)(pcVar7 + 4)] - 0x30U)) {
        return true;
      }
      pRVar1->pos_ = pcVar3 + (long)(pcVar7 + 5);
      if (pcVar2 + lVar5 + -5 == pcVar7) {
        return true;
      }
      if (9 < (byte)(pcVar3[(long)(pcVar7 + 5)] - 0x30U)) {
        return true;
      }
      pRVar1->pos_ = pcVar3 + (long)(pcVar7 + 6);
      if (pcVar2 + lVar5 + -6 == pcVar7) {
        return true;
      }
      if (9 < (byte)(pcVar3[(long)(pcVar7 + 6)] - 0x30U)) {
        return true;
      }
      pRVar1->pos_ = pcVar3 + (long)(pcVar7 + 7);
      if (pcVar2 + lVar5 + -7 == pcVar7) {
        return true;
      }
      if (9 < (byte)(pcVar3[(long)(pcVar7 + 7)] - 0x30U)) {
        return true;
      }
      pRVar1->pos_ = pcVar3 + (long)(pcVar7 + 8);
      if (pcVar2 + lVar5 + -8 == pcVar7) {
        return true;
      }
      if (9 < (byte)(pcVar3[(long)(pcVar7 + 8)] - 0x30U)) {
        return true;
      }
      pRVar1->pos_ = pcVar3 + (long)(pcVar7 + 9);
      if (pcVar2 + lVar5 + -9 == pcVar7) {
        return true;
      }
      if (9 < (byte)(pcVar3[(long)(pcVar7 + 9)] - 0x30U)) {
        return true;
      }
      pcVar4 = pcVar7 + 10;
      pRVar1->pos_ = pcVar3 + (long)pcVar4;
      if (pcVar2 + lVar5 + -10 == pcVar7) {
        return true;
      }
      pcVar7 = pcVar7 + 10;
      if (9 < (byte)(pcVar3[(long)pcVar4] - 0x30U)) {
        return true;
      }
    }
  }
  return bVar6;
}

Assistant:

static inline bool match(S& state)
        {
            if (!C0::match(state)) return false;
            // Note: yes, I unroll this loop intentionally
            while (C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state))
                ;
            return true;
        }